

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_bitmap_contains(roaring_bitmap_t *r,uint32_t val)

{
  ushort uVar1;
  uint16_t *puVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  uint8_t uVar6;
  ulong uVar7;
  ulong uVar8;
  ushort uVar9;
  int iVar10;
  _Bool _Var11;
  int *piVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  
  iVar10 = (r->high_low_container).size;
  if ((long)iVar10 != 0) {
    puVar2 = (r->high_low_container).keys;
    uVar9 = (ushort)(val >> 0x10);
    if (puVar2[(long)iVar10 + -1] != uVar9) {
      uVar14 = iVar10 - 1;
      uVar13 = 0;
      uVar8 = (ulong)uVar14;
      do {
        if ((int)uVar14 < (int)uVar13) {
          uVar7 = (ulong)~uVar13;
          break;
        }
        uVar4 = uVar13 + uVar14 >> 1;
        uVar7 = (ulong)uVar4;
        uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar13 + uVar14 & 0xfffffffe));
        if (uVar1 < uVar9) {
          uVar13 = uVar4 + 1;
          bVar5 = true;
          uVar7 = uVar8;
        }
        else if (uVar9 < uVar1) {
          uVar14 = uVar4 - 1;
          bVar5 = true;
          uVar7 = uVar8;
        }
        else {
          bVar5 = false;
        }
        uVar8 = uVar7;
      } while (bVar5);
      goto LAB_0011d690;
    }
  }
  uVar7 = (ulong)(iVar10 - 1);
LAB_0011d690:
  if (-1 < (int)uVar7) {
    uVar6 = (r->high_low_container).typecodes[uVar7 & 0xffff];
    piVar12 = (int *)(r->high_low_container).containers[uVar7 & 0xffff];
    if (uVar6 == '\x04') {
      uVar6 = (uint8_t)piVar12[2];
      if (uVar6 == '\x04') {
        __assert_fail("*type != SHARED_CONTAINER_TYPE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1062,
                      "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
      }
      piVar12 = *(int **)piVar12;
    }
    uVar9 = (ushort)val;
    if (uVar6 == '\x03') {
      lVar15 = *(long *)(piVar12 + 2);
      iVar10 = *piVar12 + -1;
      uVar14 = 0;
      do {
        if (iVar10 < (int)uVar14) {
          uVar13 = ~uVar14;
          break;
        }
        uVar13 = uVar14 + iVar10 >> 1;
        uVar1 = *(ushort *)(lVar15 + (ulong)uVar13 * 4);
        if (uVar1 < uVar9) {
          uVar14 = uVar13 + 1;
          bVar5 = true;
        }
        else if (uVar9 < uVar1) {
          iVar10 = uVar13 - 1;
          bVar5 = true;
        }
        else {
          bVar5 = false;
          piVar12 = (int *)(ulong)uVar13;
        }
        uVar13 = (uint)piVar12;
      } while (bVar5);
      if (-1 < (int)uVar13) {
        return true;
      }
      if ((uVar13 != 0xffffffff) &&
         ((int)((val & 0xffff) - (uint)*(ushort *)(lVar15 + (ulong)(-uVar13 - 2) * 4)) <=
          (int)(uint)*(ushort *)(lVar15 + 2 + (ulong)(-uVar13 - 2) * 4))) {
        return true;
      }
    }
    else {
      if (uVar6 != '\x02') {
        if (uVar6 == '\x01') {
          return (*(ulong *)(*(long *)(piVar12 + 2) + (ulong)(val >> 3 & 0x1ff8)) >>
                  ((ulong)val & 0x3f) & 1) != 0;
        }
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x124d,"_Bool container_contains(const container_t *, uint16_t, uint8_t)");
      }
      iVar10 = *piVar12 + -1;
      uVar14 = 0;
      while ((int)(uVar14 + 0x10) <= iVar10) {
        uVar13 = uVar14 + iVar10 >> 1;
        uVar1 = *(ushort *)(*(long *)(piVar12 + 2) + (ulong)(uVar14 + iVar10 & 0xfffffffe));
        iVar3 = uVar13 - 1;
        if (uVar1 <= uVar9) {
          iVar3 = iVar10;
        }
        uVar13 = uVar13 + 1;
        if (uVar9 <= uVar1) {
          uVar13 = uVar14;
          iVar10 = iVar3;
        }
        uVar14 = uVar13;
        if (uVar1 == uVar9) {
          return true;
        }
      }
      if ((int)uVar14 <= iVar10) {
        _Var11 = true;
        lVar15 = 0;
        do {
          uVar1 = *(ushort *)(*(long *)(piVar12 + 2) + (ulong)uVar14 * 2 + lVar15 * 2);
          _Var11 = (_Bool)(_Var11 & uVar1 <= uVar9 | uVar1 == uVar9);
          if (uVar9 <= uVar1) {
            return _Var11;
          }
          lVar15 = lVar15 + 1;
        } while ((iVar10 - uVar14) + 1 != (int)lVar15);
        return false;
      }
    }
  }
  return false;
}

Assistant:

bool roaring_bitmap_contains(const roaring_bitmap_t *r, uint32_t val) {
    const uint16_t hb = val >> 16;
    /*
     * the next function call involves a binary search and lots of branching.
     */
    int32_t i = ra_get_index(&r->high_low_container, hb);
    if (i < 0) return false;

    uint8_t typecode;
    // next call ought to be cheap
    container_t *container =
        ra_get_container_at_index(&r->high_low_container, i, &typecode);
    // rest might be a tad expensive, possibly involving another round of binary search
    return container_contains(container, val & 0xFFFF, typecode);
}